

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t __thiscall
loader::zesDriverGetDeviceByUuidExp
          (loader *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,zes_device_handle_t *phDevice,
          ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  ze_result_t zVar1;
  object_t<_ze_device_handle_t_*> *poVar2;
  bad_alloc *anon_var_0;
  zes_pfnDriverGetDeviceByUuidExp_t pfnGetDeviceByUuidExp;
  dditable_t *dditable;
  ze_bool_t *pzStack_40;
  ze_result_t result;
  uint32_t *subdeviceId_local;
  ze_bool_t *onSubdevice_local;
  zes_device_handle_t *phDevice_local;
  zes_driver_handle_t hDriver_local;
  zes_uuid_t uuid_local;
  
  onSubdevice_local = uuid.id._8_8_;
  uuid_local.id._0_8_ = uuid.id._0_8_;
  dditable._4_4_ = 0;
  pfnGetDeviceByUuidExp = *(zes_pfnDriverGetDeviceByUuidExp_t *)(this + 8);
  if (*(code **)(pfnGetDeviceByUuidExp + 0x9f0) == (code *)0x0) {
    uuid_local.id[8] = '\x01';
    uuid_local.id[9] = '\0';
    uuid_local.id[10] = '\0';
    uuid_local.id[0xb] = 'x';
  }
  else {
    phDevice_local = *(zes_device_handle_t **)this;
    pzStack_40 = onSubdevice;
    subdeviceId_local = (uint32_t *)phDevice;
    unique0x1000005e = hDriver;
    dditable._4_4_ =
         (**(code **)(pfnGetDeviceByUuidExp + 0x9f0))
                   (phDevice_local,hDriver,uuid_local.id._0_8_,onSubdevice_local,phDevice,
                    onSubdevice);
    uuid_local.id._8_4_ = dditable._4_4_;
    if (dditable._4_4_ == 0) {
      poVar2 = singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>::
               getInstance<_ze_device_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_ze_device_handle_t*>,_ze_device_handle_t*>
                           *)(context + 0x7e0),(_ze_device_handle_t **)onSubdevice_local,
                          (dditable_t **)&pfnGetDeviceByUuidExp);
      *(object_t<_ze_device_handle_t_*> **)onSubdevice_local = poVar2;
      uuid_local.id[8] = dditable._4_1_;
      uuid_local.id[9] = dditable._5_1_;
      uuid_local.id[10] = dditable._6_1_;
      uuid_local.id[0xb] = dditable._7_1_;
    }
  }
  zVar1._0_1_ = uuid_local.id[8];
  zVar1._1_1_ = uuid_local.id[9];
  zVar1._2_1_ = uuid_local.id[10];
  zVar1._3_1_ = uuid_local.id[0xb];
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_driver_object_t*>( hDriver )->dditable;
        auto pfnGetDeviceByUuidExp = dditable->zes.DriverExp.pfnGetDeviceByUuidExp;
        if( nullptr == pfnGetDeviceByUuidExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hDriver = reinterpret_cast<zes_driver_object_t*>( hDriver )->handle;

        // forward to device-driver
        result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phDevice = reinterpret_cast<zes_device_handle_t>(
                context->zes_device_factory.getInstance( *phDevice, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }